

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

Element * __thiscall Rml::Element::QuerySelector(Element *this,String *selectors)

{
  pointer pcVar1;
  Element *pEVar2;
  StyleSheetNodeListRaw leaf_nodes;
  String local_138;
  StyleSheetNode root_node;
  
  StyleSheetNode::StyleSheetNode(&root_node);
  StyleSheetParser::ConstructNodes(&leaf_nodes,&root_node,selectors);
  if (leaf_nodes.super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      leaf_nodes.super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = (selectors->_M_dataplus)._M_p;
    GetAddress_abi_cxx11_(&local_138,this,false,true);
    Log::Message(LT_WARNING,"Query selector \'%s\' is empty. In element %s",pcVar1,
                 local_138._M_dataplus._M_p);
    ::std::__cxx11::string::~string((string *)&local_138);
    pEVar2 = (Element *)0x0;
  }
  else {
    pEVar2 = QuerySelectorMatchRecursive(&leaf_nodes,this,this);
  }
  ::std::_Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>::~_Vector_base
            (&leaf_nodes.
              super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>);
  StyleSheetNode::~StyleSheetNode(&root_node);
  return pEVar2;
}

Assistant:

Element* Element::QuerySelector(const String& selectors)
{
	StyleSheetNode root_node;
	StyleSheetNodeListRaw leaf_nodes = StyleSheetParser::ConstructNodes(root_node, selectors);

	if (leaf_nodes.empty())
	{
		Log::Message(Log::LT_WARNING, "Query selector '%s' is empty. In element %s", selectors.c_str(), GetAddress().c_str());
		return nullptr;
	}

	return QuerySelectorMatchRecursive(leaf_nodes, this, this);
}